

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O3

bool __thiscall Indexing::CodeTree::RemovingMatcher<true>::next(RemovingMatcher<true> *this)

{
  BTPoint **ppBVar1;
  ulong uVar2;
  Stack<Indexing::CodeTree::CodeOp_*> *pSVar3;
  FlatTerm *pFVar4;
  CodeOp *pCVar5;
  CodeOp *pCVar6;
  pointer ppCVar7;
  uint64_t uVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  BTPoint *pBVar12;
  CodeOp *pCVar13;
  CodeOp **ppCVar14;
  pointer ppCVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  SearchStruct *this_00;
  BTPoint local_48;
  
  if (this->fresh == true) {
    this->fresh = false;
  }
  else {
    bVar10 = backtrack(this);
    if (!bVar10) {
      return false;
    }
  }
  bVar10 = false;
LAB_002dc3ac:
  do {
    this_00 = (SearchStruct *)(this->super_BaseMatcher).op;
    pCVar13 = (this_00->landingOp)._alternative;
    if (pCVar13 != (CodeOp *)0x0) {
      BTPoint::BTPoint(&local_48,(this->super_BaseMatcher).tp,pCVar13,
                       (long)this->firstsInBlocks->_cursor - (long)this->firstsInBlocks->_stack >> 3
                      );
      sVar9 = local_48.fibDepth;
      pCVar13 = local_48.op;
      sVar16 = local_48.tp;
      pBVar12 = (this->btStack)._cursor;
      if (pBVar12 == (this->btStack)._end) {
        Lib::Stack<Indexing::CodeTree::RemovingMatcher<true>::BTPoint>::expand(&this->btStack);
        pBVar12 = (this->btStack)._cursor;
      }
      pBVar12->fibDepth = sVar9;
      pBVar12->tp = sVar16;
      pBVar12->op = pCVar13;
      ppBVar1 = &(this->btStack)._cursor;
      *ppBVar1 = *ppBVar1 + 1;
      this_00 = (SearchStruct *)(this->super_BaseMatcher).op;
    }
    uVar2 = (this_00->landingOp)._content;
    switch((uint)uVar2 & 7) {
    case 0:
      if ((uVar2 != 0) && (this->matchingClauses == false)) {
        return true;
      }
      break;
    case 1:
      sVar16 = (this->super_BaseMatcher).tp;
      pFVar4 = (this->super_BaseMatcher).ft;
      uVar17 = (uint)pFVar4->_data[sVar16]._content & 7;
      if (((uVar17 == 4) || (uVar17 == 1)) && (uVar2 >> 3 == pFVar4[1]._data[sVar16 - 1]._content))
      {
        sVar16 = ((uint)pFVar4[1]._data[sVar16]._content >> 3 & 0x7ffffff) + sVar16;
LAB_002dc5b8:
        (this->super_BaseMatcher).tp = sVar16;
LAB_002dc5bc:
        (this->super_BaseMatcher).op = (this->super_BaseMatcher).op + 1;
        bVar10 = false;
        goto LAB_002dc3ac;
      }
      break;
    case 2:
      return true;
    case 3:
      sVar16 = (this->super_BaseMatcher).tp;
      pFVar4 = (this->super_BaseMatcher).ft;
      uVar17 = (uint)pFVar4->_data[sVar16]._content;
      uVar18 = uVar17 & 7;
      if (((uVar18 == 4) || (uVar18 == 1)) && ((uVar17 >> 3 & 0x7ffffff) == (uint)(uVar2 >> 3))) {
        Kernel::FlatTerm::Entry::expand(pFVar4->_data + sVar16);
        sVar16 = (this->super_BaseMatcher).tp + 3;
        goto LAB_002dc5b8;
      }
      break;
    case 4:
      uVar17 = (uint)((this->super_BaseMatcher).ft)->_data[(this->super_BaseMatcher).tp]._content;
      if ((uVar17 & 7) == 2) {
        *(uint *)((long)(this->bindings)._array + (uVar2 >> 1 & 0x3fffffffc)) =
             uVar17 >> 3 & 0x7ffffff;
        bVar10 = Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 insert(&(this->range)._map);
        if (bVar10) {
          sVar16 = (this->super_BaseMatcher).tp;
          goto LAB_002dc5b5;
        }
      }
      break;
    case 5:
      sVar16 = (this->super_BaseMatcher).tp;
      uVar17 = (uint)((this->super_BaseMatcher).ft)->_data[sVar16]._content;
      if (((uVar17 & 7) == 2) &&
         (*(uint *)((long)(this->bindings)._array + (uVar2 >> 1 & 0x3fffffffc)) ==
          (uVar17 >> 3 & 0x7ffffff))) {
LAB_002dc5b5:
        sVar16 = sVar16 + 1;
        goto LAB_002dc5b8;
      }
      break;
    case 6:
      pCVar13 = this_00[2].landingOp._alternative;
      if (pCVar13 != (CodeOp *)this_00[2].landingOp._content) {
        this_00[2].landingOp._alternative = (CodeOp *)&pCVar13[-2]._alternative;
        pCVar5 = (CodeOp *)pCVar13[-1]._content;
        pCVar6 = pCVar13[-1]._alternative;
        (this_00->landingOp)._alternative = pCVar13[-2]._alternative;
        (this_00->landingOp)._content = (uint64_t)pCVar5;
        pSVar3 = (Stack<Indexing::CodeTree::CodeOp_*> *)
                 this_00[2].targets.
                 super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppCVar14 = pSVar3->_stack + (long)pCVar6;
        pSVar3->_cursor = ppCVar14;
        if (ppCVar14 == pSVar3->_end) {
          Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(pSVar3);
          ppCVar14 = pSVar3->_cursor;
        }
        *ppCVar14 = pCVar5;
        pSVar3->_cursor = pSVar3->_cursor + 1;
        return true;
      }
      ppCVar7 = this_00[2].targets.
                super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar15 = (pointer)((long)this_00[2].targets.
                                 super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      this_00[2].targets.
      super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar15;
      ppCVar7[2] = (CodeOp *)(&ppCVar7[1]->_content + (long)this_00[3].landingOp._alternative);
      if (this_00[3].targets.
          super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
          ._M_impl.super__Vector_impl_data._M_start <= ppCVar15) {
        return false;
      }
      uVar8 = this_00[3].landingOp._content;
      *(undefined8 *)&this_00->kind =
           *(undefined8 *)(*(long *)&this_00[3].kind + 8 + (long)ppCVar15 * 0x18);
      (this_00->landingOp)._alternative = (CodeOp *)0x0;
      (this_00->landingOp)._content = uVar8;
      return true;
    case 7:
      if (!bVar10) goto LAB_002dc5bc;
      break;
    default:
      pCVar13 = SearchStruct::getTargetOp
                          (this_00,((this->super_BaseMatcher).ft)->_data +
                                   (this->super_BaseMatcher).tp);
      if (pCVar13 != (CodeOp *)0x0) {
        (this->super_BaseMatcher).op = pCVar13;
        pSVar3 = this->firstsInBlocks;
        ppCVar14 = pSVar3->_cursor;
        if (ppCVar14 == pSVar3->_end) {
          Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(pSVar3);
          ppCVar14 = pSVar3->_cursor;
        }
        *ppCVar14 = pCVar13;
        pSVar3->_cursor = pSVar3->_cursor + 1;
        goto LAB_002dc3ac;
      }
    }
    bVar11 = backtrack(this);
    bVar10 = true;
    if (!bVar11) {
      return false;
    }
  } while( true );
}

Assistant:

bool CodeTree::RemovingMatcher<checkRange>::next()
{
  if(fresh) {
    fresh=false;
  }
  else {
    //we backtrack from what we found in the previous run
    if(!backtrack()) {
      return false;
    }
  }


  bool shouldBacktrack=false;
  for(;;) {
    if(op->alternative()) {
      btStack.push(BTPoint(tp, op->alternative(), firstsInBlocks->size()));
    }
    switch(op->_instruction()) {
      case SUCCESS_OR_FAIL:
        if(op->isFail()) {
          shouldBacktrack=true;
          break;
        }
        if(matchingClauses) {
          //we can succeed only in certain depth and that will be handled separately
          shouldBacktrack=true;
        }
        else {
          //we are matching terms in a TermCodeTree
          return true;
        }
        break;
      case LIT_END:
        ASS(matchingClauses);
        return true;
      case CHECK_GROUND_TERM:
        shouldBacktrack=!doCheckGroundTerm();
        break;
      case CHECK_FUN:
        shouldBacktrack=!doCheckFun();
        break;
      case ASSIGN_VAR:
        shouldBacktrack=!doAssignVar();
        break;
      case CHECK_VAR:
        shouldBacktrack=!doCheckVar();
        break;
      case SEARCH_STRUCT:
        if(doSearchStruct()) {
          //a new value of @b op is assigned, so restart the loop
          continue;
        }
        else {
          shouldBacktrack=true;
        }
        break;
    }
    if(shouldBacktrack) {
      if(!backtrack()) {
        return false;
      }
      // dead store, left here in case it should have been a static?
      // shouldBacktrack = false;
    }
    else {
      //the SEARCH_STRUCT operation does not appear in CodeBlocks
      ASS(!op->isSearchStruct());
      //In each CodeBlock there is always either operation LIT_END or FAIL.
      //As we haven't encountered one yet, we may safely increase the
      //operation pointer
      op++;
    }
  }
}